

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cxx
# Opt level: O1

string * read_file(string *__return_storage_ptr__,string *file_name)

{
  char cVar1;
  istream *piVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string tmp;
  ifstream infile;
  long *local_278 [2];
  long local_268 [2];
  undefined1 *local_258;
  long local_250;
  undefined1 local_248;
  undefined7 uStack_247;
  long local_238 [65];
  
  local_258 = &local_248;
  local_250 = 0;
  local_248 = 0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::ifstream::ifstream(local_238);
  std::ifstream::open((char *)local_238,(_Ios_Openmode)(file_name->_M_dataplus)._M_p);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    while( true ) {
      cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_258,cVar1);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      local_278[0] = local_268;
      std::__cxx11::string::_M_construct<char*>((string *)local_278,local_258,local_258 + local_250)
      ;
      std::__cxx11::string::append((char *)local_278);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_278[0]);
      if (local_278[0] != local_268) {
        operator_delete(local_278[0],local_268[0] + 1);
      }
    }
    std::ifstream::close();
  }
  std::ifstream::~ifstream(local_238);
  if (local_258 != &local_248) {
    operator_delete(local_258,CONCAT71(uStack_247,local_248) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string read_file(const std::string &file_name) {
    std::string tmp;
    std::string file_content;
    std::ifstream infile;

    infile.open(file_name.c_str(), std::ifstream::binary);

    if (!infile.is_open()) {
        return file_content;
    }

    // 以 '\n' 作为分行标识
    while (getline(infile, tmp))
        file_content += tmp + "\n";

    infile.close();

    return file_content;
}